

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint * gf_polydiv_recursive(uint *a,uint alen,uint *b,uint blen,uint *new_len)

{
  uint end;
  uint b_00;
  uint uVar1;
  uint *__ptr;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint i_1;
  
  iVar6 = blen - alen;
  uVar5 = (ulong)alen;
  while (uVar1 = (uint)uVar5, blen <= uVar1) {
    end = uVar1 - 1;
    b_00 = gf_div(a[end],b[blen - 1]);
    __ptr = vector_new(uVar1);
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = 0;
      if (uVar1 - blen <= uVar3) {
        uVar4 = b[(uint)(iVar6 + (int)uVar3)];
      }
      __ptr[uVar3] = uVar4;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = gf_mul(__ptr[uVar3],b_00);
      __ptr[uVar3] = uVar1;
      a[uVar3] = a[uVar3] ^ uVar1;
    }
    puVar2 = submatrix(a,0,end);
    free(a);
    free(__ptr);
    if (new_len != (uint *)0x0) {
      *new_len = end;
    }
    iVar6 = iVar6 + 1;
    uVar5 = (ulong)end;
    a = puVar2;
  }
  return a;
}

Assistant:

uint32_t *gf_polydiv_recursive(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *new_len)
{
    if (alen < blen)
        return a;

    uint32_t q = gf_div(a[alen - 1], b[blen - 1]);

    // g = [0,0...0, b[0], b[1], b[n]]
    // alen-blen zeros at the start
    uint32_t *g = vector_new(alen);
    for (uint32_t i = 0; i < alen; i++)
        g[i] = (i < alen - blen) ? 0 : b[i - (alen - blen)];

    for (uint32_t i = 0; i < alen; i++)
    {
        g[i] = gf_mul(g[i], q);
        a[i] = gf_sum(a[i], g[i]);
    }

    uint32_t a_new_len = alen - 1;
    uint32_t *a_new = submatrix(a, 0, a_new_len);

    vector_free(a);
    vector_free(g);

    if (new_len != NULL)
        *new_len = a_new_len;

    return gf_polydiv_recursive(a_new, a_new_len, b, blen, new_len);
}